

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.cc
# Opt level: O1

void duckdb_re2::CoalesceWalker::DoCoalesce(Regexp **r1ptr,Regexp **r2ptr)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  Regexp *this;
  Regexp *this_00;
  int iVar4;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar5;
  Regexp *pRVar6;
  anon_struct_8_2_38aa0e4f_for_repeat aVar7;
  Regexp *this_01;
  ulong uVar8;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar9;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  this = *r1ptr;
  paVar9 = &this->field_5;
  paVar5 = paVar9;
  if (1 < this->nsub_) {
    paVar5 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
  }
  this_00 = *r2ptr;
  pRVar6 = Regexp::Incref(paVar5->subone_);
  pRVar6 = Regexp::Repeat(pRVar6,(uint)this->parse_flags_,0,0);
  switch(this->op_) {
  case '\a':
    aVar7.max_ = -1;
    aVar7.min_ = 0;
    goto LAB_011feb92;
  case '\b':
    aVar7.max_ = -1;
    aVar7.min_ = 1;
LAB_011feb92:
    (pRVar6->arguments).repeat = aVar7;
    break;
  case '\t':
    *(int *)&pRVar6->arguments = 1;
    *(int *)((long)&pRVar6->arguments + 4) = 0;
    break;
  case '\n':
    (pRVar6->arguments).repeat.min_ = (this->arguments).repeat.min_;
    (pRVar6->arguments).repeat.max_ = (this->arguments).repeat.max_;
    break;
  default:
    Regexp::Decref(pRVar6);
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"DoCoalesce failed: r1->op() is ",0x1f);
    std::ostream::operator<<(local_1a8,(uint)this->op_);
    goto LAB_011fed4a;
  }
  switch(this_00->op_) {
  case '\x03':
  case '\f':
  case '\r':
  case '\x14':
    piVar1 = &(pRVar6->arguments).repeat.min_;
    *piVar1 = *piVar1 + 1;
  case '\t':
    iVar2 = (pRVar6->arguments).repeat.max_;
    if (iVar2 != -1) {
      (pRVar6->arguments).repeat.max_ = iVar2 + 1;
    }
    break;
  case '\x04':
    if (1 < this->nsub_) {
      paVar9 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
    }
    uVar3 = (this_00->arguments).repeat.max_;
    uVar8 = 1;
    if (1 < (int)uVar3) {
      uVar8 = 1;
      do {
        if (*(int *)((long)&(((this_00->arguments).capture.name_)->_M_dataplus)._M_p + uVar8 * 4) !=
            (paVar9->subone_->arguments).repeat.max_) goto LAB_011fecc3;
        uVar8 = uVar8 + 1;
      } while (uVar3 != uVar8);
      uVar8 = (ulong)uVar3;
    }
LAB_011fecc3:
    piVar1 = &(pRVar6->arguments).repeat.min_;
    iVar4 = (int)uVar8;
    *piVar1 = *piVar1 + iVar4;
    iVar2 = (pRVar6->arguments).repeat.max_;
    if (iVar2 != -1) {
      (pRVar6->arguments).repeat.max_ = iVar2 + iVar4;
    }
    if (iVar4 != (this_00->arguments).repeat.max_) {
      *r1ptr = pRVar6;
      pRVar6 = Regexp::LiteralString
                         ((Rune *)((long)&(((this_00->arguments).capture.name_)->_M_dataplus)._M_p +
                                  (uVar8 & 0xffffffff) * 4),(this_00->arguments).repeat.max_ - iVar4
                          ,(uint)this_00->parse_flags_);
      goto LAB_011fec67;
    }
    break;
  default:
    Regexp::Decref(pRVar6);
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"DoCoalesce failed: r2->op() is ",0x1f);
    std::ostream::operator<<(local_1a8,(uint)this_00->op_);
LAB_011fed4a:
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    return;
  case '\b':
    piVar1 = &(pRVar6->arguments).repeat.min_;
    *piVar1 = *piVar1 + 1;
  case '\a':
switchD_011febb4_caseD_7:
    (pRVar6->arguments).repeat.max_ = -1;
    break;
  case '\n':
    piVar1 = &(pRVar6->arguments).repeat.min_;
    *piVar1 = *piVar1 + (this_00->arguments).repeat.min_;
    iVar2 = (this_00->arguments).repeat.max_;
    if (iVar2 == -1) goto switchD_011febb4_caseD_7;
    iVar4 = (pRVar6->arguments).repeat.max_;
    if (iVar4 != -1) {
      (pRVar6->arguments).repeat.max_ = iVar4 + iVar2;
    }
  }
  this_01 = (Regexp *)operator_new(0x28);
  Regexp::Regexp(this_01,kRegexpEmptyMatch,NoParseFlags);
  *r1ptr = this_01;
LAB_011fec67:
  *r2ptr = pRVar6;
  Regexp::Decref(this);
  Regexp::Decref(this_00);
  return;
}

Assistant:

void CoalesceWalker::DoCoalesce(Regexp** r1ptr, Regexp** r2ptr) {
  Regexp* r1 = *r1ptr;
  Regexp* r2 = *r2ptr;

  Regexp* nre = Regexp::Repeat(
      r1->sub()[0]->Incref(), r1->parse_flags(), 0, 0);

  switch (r1->op()) {
    case kRegexpStar:
      nre->arguments.repeat.min_ = 0;
      nre->arguments.repeat.max_ = -1;
      break;

    case kRegexpPlus:
      nre->arguments.repeat.min_ = 1;
      nre->arguments.repeat.max_ = -1;
      break;

    case kRegexpQuest:
      nre->arguments.repeat.min_ = 0;
      nre->arguments.repeat.max_ = 1;
      break;

    case kRegexpRepeat:
      nre->arguments.repeat.min_ = r1->min();
      nre->arguments.repeat.max_ = r1->max();
      break;

    default:
      nre->Decref();
      LOG(DFATAL) << "DoCoalesce failed: r1->op() is " << r1->op();
      return;
  }

  switch (r2->op()) {
    case kRegexpStar:
      nre->arguments.repeat.max_ = -1;
      goto LeaveEmpty;

    case kRegexpPlus:
      nre->arguments.repeat.min_++;
      nre->arguments.repeat.max_ = -1;
      goto LeaveEmpty;

    case kRegexpQuest:
      if (nre->max() != -1)
        nre->arguments.repeat.max_++;
      goto LeaveEmpty;

    case kRegexpRepeat:
      nre->arguments.repeat.min_ += r2->min();
      if (r2->max() == -1)
        nre->arguments.repeat.max_ = -1;
      else if (nre->max() != -1)
        nre->arguments.repeat.max_ += r2->max();
      goto LeaveEmpty;

    case kRegexpLiteral:
    case kRegexpCharClass:
    case kRegexpAnyChar:
    case kRegexpAnyByte:
      nre->arguments.repeat.min_++;
      if (nre->max() != -1)
        nre->arguments.repeat.max_++;
      goto LeaveEmpty;

    LeaveEmpty:
      *r1ptr = new Regexp(kRegexpEmptyMatch, Regexp::NoParseFlags);
      *r2ptr = nre;
      break;

    case kRegexpLiteralString: {
      Rune r = r1->sub()[0]->rune();
      // Determine how much of the literal string is removed.
      // We know that we have at least one rune. :)
      int n = 1;
      while (n < r2->nrunes() && r2->runes()[n] == r)
        n++;
      nre->arguments.repeat.min_ += n;
      if (nre->max() != -1)
        nre->arguments.repeat.max_ += n;
      if (n == r2->nrunes())
        goto LeaveEmpty;
      *r1ptr = nre;
      *r2ptr = Regexp::LiteralString(
          &r2->runes()[n], r2->nrunes() - n, r2->parse_flags());
      break;
    }

    default:
      nre->Decref();
      LOG(DFATAL) << "DoCoalesce failed: r2->op() is " << r2->op();
      return;
  }

  r1->Decref();
  r2->Decref();
}